

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1560.c
# Opt level: O0

CURLUcode updateurl(CURLU *u,char *cmd,uint setflags)

{
  int iVar1;
  CURLUPart CVar2;
  char *pcVar3;
  char local_138 [4];
  CURLUPart what;
  char value [80];
  char part [80];
  char buf [80];
  size_t n;
  char *e;
  char *pcStack_30;
  CURLUcode uc;
  char *p;
  uint setflags_local;
  char *cmd_local;
  CURLU *u_local;
  
  pcStack_30 = cmd;
  do {
    if ((pcStack_30 == (char *)0x0) || (pcVar3 = strchr(pcStack_30,0x2c), pcVar3 == (char *)0x0)) {
      return CURLUE_OK;
    }
    memcpy(part + 0x48,pcStack_30,(long)pcVar3 - (long)pcStack_30);
    part[((long)pcVar3 - (long)pcStack_30) + 0x48] = '\0';
    iVar1 = __isoc99_sscanf(part + 0x48,"%79[^=]=%79[^,]",value + 0x48,local_138);
    if (iVar1 == 2) {
      CVar2 = part2id(value + 0x48);
      if (CURLUPART_ZONEID < CVar2) {
        curl_mfprintf(_stderr,"UNKNOWN part \'%s\'\n",value + 0x48);
      }
      iVar1 = strcmp("NULL",local_138);
      if (iVar1 == 0) {
        e._4_4_ = curl_url_set(u,CVar2,0,setflags);
      }
      else {
        iVar1 = strcmp("\"\"",local_138);
        if (iVar1 == 0) {
          e._4_4_ = curl_url_set(u,CVar2,"",setflags);
        }
        else {
          e._4_4_ = curl_url_set(u,CVar2,local_138,setflags);
        }
      }
      if (e._4_4_ != CURLUE_OK) {
        return e._4_4_;
      }
    }
    pcStack_30 = pcVar3 + 1;
  } while( true );
}

Assistant:

static CURLUcode updateurl(CURLU *u, const char *cmd, unsigned int setflags)
{
  const char *p = cmd;
  CURLUcode uc;

  /* make sure the last command ends with a comma too! */
  while(p) {
    char *e = strchr(p, ',');
    if(e) {
      size_t n = e-p;
      char buf[80];
      char part[80];
      char value[80];
      memcpy(buf, p, n);
      buf[n] = 0;
      if(2 == sscanf(buf, "%79[^=]=%79[^,]", part, value)) {
        CURLUPart what = part2id(part);
#if 0
        /* for debugging this */
        fprintf(stderr, "%s = %s [%d]\n", part, value, (int)what);
#endif
        if(what > CURLUPART_ZONEID)
          fprintf(stderr, "UNKNOWN part '%s'\n", part);

        if(!strcmp("NULL", value))
          uc = curl_url_set(u, what, NULL, setflags);
        else if(!strcmp("\"\"", value))
          uc = curl_url_set(u, what, "", setflags);
        else
          uc = curl_url_set(u, what, value, setflags);
        if(uc)
          return uc;
      }
      p = e + 1;
      continue;
    }
    break;
  }
  return CURLUE_OK;
}